

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableSlow<google::protobuf::internal::LazyString>
          (ArenaStringPtr *this,Arena *arena,LazyString *lazy_default)

{
  pointer pcVar1;
  LogMessage *other;
  string *psVar2;
  string *psVar3;
  LogFinisher local_61;
  LogMessage local_60;
  
  if ((this->tagged_ptr_).ptr_ != (void *)0x0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,"third_party/protobuf-lite/arenastring.cc",0x93);
    other = LogMessage::operator<<(&local_60,"CHECK failed: IsDefault(default_value): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  psVar3 = (lazy_default->inited_)._M_b._M_p;
  if (psVar3 == (string *)0x0) {
    psVar3 = LazyString::Init_abi_cxx11_(lazy_default);
  }
  if (arena == (Arena *)0x0) {
    psVar2 = (string *)operator_new(0x20);
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar2,pcVar1,pcVar1 + psVar3->_M_string_length);
  }
  else {
    if (((byte)arena[0x18] & 1) != 0) {
      MutableSlow<google::protobuf::internal::LazyString>((ArenaStringPtr *)arena);
    }
    psVar2 = (string *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       ((ArenaImpl *)arena,0x20,arena_destruct_object<std::__cxx11::string>);
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar2,pcVar1,pcVar1 + psVar3->_M_string_length);
  }
  (this->tagged_ptr_).ptr_ = psVar2;
  return psVar2;
}

Assistant:

std::string* ArenaStringPtr::MutableSlow(::google::protobuf::Arena* arena,
                                         const Lazy&... lazy_default) {
  const std::string* const default_value =
      sizeof...(Lazy) == 0 ? &GetEmptyStringAlreadyInited() : nullptr;
  GOOGLE_DCHECK(IsDefault(default_value));
  std::string* new_string =
      Arena::Create<std::string>(arena, lazy_default.get()...);
  tagged_ptr_.Set(new_string);
  return new_string;
}